

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O1

void __thiscall DStrifeStatusBar::DrawMainBar(DStrifeStatusBar *this)

{
  FImageCollection *this_00;
  uint uVar1;
  player_t *ppVar2;
  APlayerPawn *pAVar3;
  DFrameBuffer *this_01;
  FTexture *pFVar4;
  AInventory *pAVar5;
  ulong uVar6;
  PClass *p;
  PClassActor *type;
  AInventory *pAVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  AAmmo *ammo1;
  int ammocount2;
  int ammocount1;
  AAmmo *ammo2;
  AAmmo *local_50;
  int local_44;
  int local_40;
  FName local_3c;
  AAmmo *local_38;
  
  if ((this->CurrentPop != 0) && (this->PopHeight < 0)) {
    iVar8 = (this->super_DBaseStatusBar).ST_Y + -8;
    if ((this->super_DBaseStatusBar).Scaled == true) {
      iVar8 = (iVar8 * (screen->super_DSimpleCanvas).super_DCanvas.Height) / 200;
    }
    DrawPopScreen(this,iVar8);
  }
  this_00 = &this->Images;
  pFVar4 = FImageCollection::operator[](this_00,2);
  DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,0,0,(FRemapTable *)0x0);
  pFVar4 = FImageCollection::operator[](this_00,3);
  DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,0,-8,(FRemapTable *)0x0);
  DrINumber(this,((this->super_DBaseStatusBar).CPlayer)->health,0x4f,-6,8);
  ppVar2 = (this->super_DBaseStatusBar).CPlayer;
  if ((ppVar2->cheats & 2) == 0) {
    iVar8 = ppVar2->health;
    iVar9 = 0;
    if (-1 < iVar8) {
      iVar9 = 200;
      if (iVar8 < 200) {
        iVar9 = iVar8;
      }
      if (iVar8 == 999) {
        iVar9 = iVar8;
      }
    }
    if ((this->HealthBar).VialLevel == iVar9) goto LAB_004b24b7;
    (this->HealthBar).VialLevel = iVar9;
  }
  else {
    if ((this->HealthBar).VialLevel == 999) goto LAB_004b24b7;
    (this->HealthBar).VialLevel = 999;
  }
  (this->HealthBar).NeedRefresh = true;
LAB_004b24b7:
  DBaseStatusBar::DrawImage
            (&this->super_DBaseStatusBar,&(this->HealthBar).super_FTexture,0x31,4,(FRemapTable *)0x0
            );
  DBaseStatusBar::DrawImage
            (&this->super_DBaseStatusBar,&(this->HealthBar).super_FTexture,0x31,7,(FRemapTable *)0x0
            );
  pAVar5 = AActor::FindInventory
                     (&((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                      (PClassActor *)ABasicArmor::RegistrationInfo.MyClass,false);
  if ((pAVar5 != (AInventory *)0x0) && (0 < pAVar5->Amount)) {
    uVar6 = (ulong)(pAVar5->Icon).texnum;
    if (uVar6 < TexMan.Textures.Count) {
      pFVar4 = TexMan.Textures.Array[TexMan.Translation.Array[uVar6]].Texture;
    }
    else {
      pFVar4 = (FTexture *)0x0;
    }
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,2,9,(FRemapTable *)0x0);
    DrINumber(this,pAVar5->Amount,0x1b,0x17,0x13);
  }
  DBaseStatusBar::GetCurrentAmmo
            (&this->super_DBaseStatusBar,&local_50,&local_38,&local_40,&local_44);
  if (local_50 != (AAmmo *)0x0) {
    DrINumber(this,(local_50->super_AInventory).Amount,0x137,-6,8);
    uVar6 = (ulong)(local_50->super_AInventory).Icon.texnum;
    if (uVar6 < TexMan.Textures.Count) {
      pFVar4 = TexMan.Textures.Array[TexMan.Translation.Array[uVar6]].Texture;
    }
    else {
      pFVar4 = (FTexture *)0x0;
    }
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,0x122,0xd,(FRemapTable *)0x0);
  }
  pAVar3 = ((this->super_DBaseStatusBar).CPlayer)->mo;
  local_3c.Index = 0x5b;
  p = PClass::FindClass(&local_3c);
  type = dyn_cast<PClassActor>((DObject *)p);
  pAVar5 = AActor::FindInventory(&pAVar3->super_AActor,type,false);
  if (pAVar5 != (AInventory *)0x0) {
    uVar6 = (ulong)(pAVar5->Icon).texnum;
    if (uVar6 < TexMan.Textures.Count) {
      pFVar4 = TexMan.Textures.Array[TexMan.Translation.Array[uVar6]].Texture;
    }
    else {
      pFVar4 = (FTexture *)0x0;
    }
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar4,0xfd,7,(FRemapTable *)0x0);
  }
  ((this->super_DBaseStatusBar).CPlayer)->inventorytics = 0;
  pAVar5 = DBaseStatusBar::ValidateInvFirst(&this->super_DBaseStatusBar,6);
  (((this->super_DBaseStatusBar).CPlayer)->mo->InvFirst).field_0.p = pAVar5;
  pAVar3 = ((this->super_DBaseStatusBar).CPlayer)->mo;
  pAVar5 = (pAVar3->InvFirst).field_0.p;
  if ((pAVar5 != (AInventory *)0x0) &&
     (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (pAVar3->InvFirst).field_0.p = (AInventory *)0x0;
    pAVar5 = (AInventory *)0x0;
  }
  if (pAVar5 != (AInventory *)0x0) {
    iVar8 = 0x4a;
    uVar10 = 0;
    do {
      pAVar3 = ((this->super_DBaseStatusBar).CPlayer)->mo;
      pAVar7 = (pAVar3->InvSel).field_0.p;
      if ((pAVar7 != (AInventory *)0x0) &&
         (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar3->InvSel).field_0.p = (AInventory *)0x0;
        pAVar7 = (AInventory *)0x0;
      }
      this_01 = screen;
      if (pAVar5 == pAVar7) {
        pFVar4 = FImageCollection::operator[](this_00,this->CursorImage);
        DCanvas::DrawTexture
                  ((DCanvas *)this_01,pFVar4,
                   (double)(*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24 + iVar8 +
                           -0x20),(double)((this->super_DBaseStatusBar).ST_Y + 0xc),0x40001392,
                   1.0 - this->ItemFlash,(ulong)(this->super_DBaseStatusBar).Scaled,0x4000138c,0);
      }
      uVar1 = (pAVar5->Icon).texnum;
      if (0 < (long)(int)uVar1) {
        if (uVar1 < TexMan.Textures.Count) {
          pFVar4 = TexMan.Textures.Array[TexMan.Translation.Array[(int)uVar1]].Texture;
        }
        else {
          pFVar4 = (FTexture *)0x0;
        }
        DBaseStatusBar::DrawDimImage
                  (&this->super_DBaseStatusBar,pFVar4,iVar8 + -0x1a,0xe,pAVar5->Amount < 1);
      }
      DrINumber(this,pAVar5->Amount,iVar8,0x17,0x13);
      pAVar5 = AInventory::NextInv(pAVar5);
      if (pAVar5 == (AInventory *)0x0) {
        return;
      }
      iVar8 = iVar8 + 0x23;
      bVar11 = uVar10 < 5;
      uVar10 = uVar10 + 1;
    } while (bVar11);
  }
  return;
}

Assistant:

void DrawMainBar ()
	{
		AInventory *item;
		int i;

		// Pop screen (log, keys, and status)
		if (CurrentPop != POP_None && PopHeight < 0)
		{
			DrawPopScreen (Scaled ? (ST_Y - 8) * screen->GetHeight() / 200 : ST_Y - 8);
		}

		DrawImage (Images[imgINVBACK], 0, 0);
		DrawImage (Images[imgINVTOP], 0, -8);

		// Health
		DrINumber (CPlayer->health, 79, -6, imgFONG0);
		if (CPlayer->cheats & CF_GODMODE)
		{
			HealthBar.SetVial (999);
		}
		else
		{
			HealthBar.SetVial (CPlayer->health);
		}
		DrawImage (&HealthBar, 49, 4);
		DrawImage (&HealthBar, 49, 7);

		// Armor
		item = CPlayer->mo->FindInventory<ABasicArmor>();
		if (item != NULL && item->Amount > 0)
		{
			DrawImage (TexMan(item->Icon), 2, 9);
			DrINumber (item->Amount, 27, 23, imgFONY0);
		}

		// Ammo
		AAmmo *ammo1, *ammo2;
		int ammocount1, ammocount2;

		GetCurrentAmmo (ammo1, ammo2, ammocount1, ammocount2);
		if (ammo1 != NULL)
		{
			DrINumber (ammo1->Amount, 311, -6, imgFONG0);
			DrawImage (TexMan(ammo1->Icon), 290, 13);
			if (ammo2 != NULL)
			{
/*				int y = MIN (-5 - BigHeight, -5 - TexMan(ammo1->Icon)->GetHeight());
				screen->DrawTexture (TexMan(ammo2->Icon), -14, y,
					DTA_HUDRules, HUD_Normal,
					DTA_CenterBottomOffset, true,
					TAG_DONE);
				DrBNumberOuterFont (ammo2->Amount, -67, y - BigHeight);
*/			}
		}

		// Sigil
		item = CPlayer->mo->FindInventory(PClass::FindActor(NAME_Sigil));
		if (item != NULL)
		{
			DrawImage (TexMan(item->Icon), 253, 7);
		}

		// Inventory
		CPlayer->inventorytics = 0;
		CPlayer->mo->InvFirst = ValidateInvFirst (6);
		for (item = CPlayer->mo->InvFirst, i = 0; item != NULL && i < 6; item = item->NextInv(), ++i)
		{
			if (item == CPlayer->mo->InvSel)
			{
				screen->DrawTexture (Images[CursorImage],
					42 + 35*i + ST_X, 12 + ST_Y,
					DTA_Bottom320x200, Scaled,
					DTA_AlphaF, 1. - ItemFlash,
					TAG_DONE);
			}
			if (item->Icon.isValid())
			{
				DrawDimImage (TexMan(item->Icon), 48 + 35*i, 14, item->Amount <= 0);
			}
			DrINumber (item->Amount, 74 + 35*i, 23, imgFONY0);
		}
	}